

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

Value * __thiscall Json::Path::resolve(Path *this,Value *root)

{
  uint uVar1;
  ArrayIndex AVar2;
  pointer key;
  
  key = (this->args_).super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>.
        _M_impl.super__Vector_impl_data._M_start;
  do {
    if (key == (this->args_).
               super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl.
               super__Vector_impl_data._M_finish) {
      return root;
    }
    if (key->kind_ == kindKey) {
      if (root->field_0x8 != '\a') {
        return Value::null;
      }
      root = Value::operator[](root,&key->key_);
      Value::nullSingleton();
      if (root == &Value::nullSingleton::nullStatic) {
        return Value::null;
      }
    }
    else if (key->kind_ == kindIndex) {
      if (root->field_0x8 != '\x06') {
        return Value::null;
      }
      uVar1 = key->index_;
      AVar2 = Value::size(root);
      if (AVar2 <= uVar1) {
        return Value::null;
      }
      root = Value::operator[](root,key->index_);
    }
    key = key + 1;
  } while( true );
}

Assistant:

const Value& Path::resolve(const Value& root) const {
  const Value* node = &root;
  for (Args::const_iterator it = args_.begin(); it != args_.end(); ++it) {
    const PathArgument& arg = *it;
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray() || !node->isValidIndex(arg.index_)) {
        // Error: unable to resolve path (array value expected at position...
        return Value::null;
      }
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject()) {
        // Error: unable to resolve path (object value expected at position...)
        return Value::null;
      }
      node = &((*node)[arg.key_]);
      if (node == &Value::nullSingleton()) {
        // Error: unable to resolve path (object has no member named '' at
        // position...)
        return Value::null;
      }
    }
  }
  return *node;
}